

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_buffer.cpp
# Opt level: O3

MemoryRequirement __thiscall
duckdb::FileBuffer::CalculateMemory(FileBuffer *this,uint64_t user_size,uint64_t block_header_size)

{
  ulong uVar1;
  MemoryRequirement MVar2;
  
  uVar1 = user_size + block_header_size + 0xfff & 0xfffffffffffff000;
  if (this->type == TINY_BUFFER) {
    block_header_size = 0;
    uVar1 = user_size;
  }
  MVar2.header_size = block_header_size;
  MVar2.alloc_size = uVar1;
  return MVar2;
}

Assistant:

FileBuffer::MemoryRequirement FileBuffer::CalculateMemory(uint64_t user_size, uint64_t block_header_size) const {
	FileBuffer::MemoryRequirement result;
	if (type == FileBufferType::TINY_BUFFER) {
		// We never do IO on tiny buffers, so there's no need to add a header or sector-align.
		result.header_size = 0;
		result.alloc_size = user_size;
	} else {
		result.header_size = block_header_size;
		result.alloc_size = AlignValue<idx_t, Storage::SECTOR_SIZE>(result.header_size + user_size);
	}
	return result;
}